

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_beziers.cpp
# Opt level: O0

Bezier<3UL> * bezier::test::defaultCubicBezier(void)

{
  initializer_list<bezier::Vec2> __l;
  Bezier<3UL> *in_RDI;
  allocator<bezier::Vec2> local_71;
  Vec2 local_70;
  Vec2 local_60;
  Vec2 local_50;
  Vec2 local_40;
  Vec2 *local_30;
  size_type local_28;
  vector<bezier::Vec2,_std::allocator<bezier::Vec2>_> local_20;
  
  Vec2::Vec2(&local_70,120.0,160.0);
  Vec2::Vec2(&local_60,35.0,200.0);
  Vec2::Vec2(&local_50,220.0,260.0);
  Vec2::Vec2(&local_40,220.0,40.0);
  local_28 = 4;
  local_30 = &local_70;
  std::allocator<bezier::Vec2>::allocator(&local_71);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::vector<bezier::Vec2,_std::allocator<bezier::Vec2>_>::vector(&local_20,__l,&local_71);
  Bezier<3UL>::Bezier(in_RDI,&local_20);
  std::vector<bezier::Vec2,_std::allocator<bezier::Vec2>_>::~vector(&local_20);
  std::allocator<bezier::Vec2>::~allocator(&local_71);
  return in_RDI;
}

Assistant:

bezier::Bezier<3> bezier::test::defaultCubicBezier()
{
    return ::bezier::Bezier<3>({
        {120, 160},
        {35,  200},
        {220, 260},
        {220,  40}
    });
}